

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::Stack<Kernel::Literal*>::loadFromIterator<Lib::VirtualIterator<Kernel::Literal*>>
          (Stack<Kernel::Literal_*> *this,VirtualIterator<Kernel::Literal_*> *it)

{
  bool bVar1;
  Stack<Kernel::Literal_*> *in_RSI;
  Literal *in_stack_ffffffffffffffd8;
  
  while( true ) {
    bVar1 = VirtualIterator<Kernel::Literal_*>::hasNext
                      ((VirtualIterator<Kernel::Literal_*> *)0x840027);
    if (!bVar1) break;
    VirtualIterator<Kernel::Literal_*>::next((VirtualIterator<Kernel::Literal_*> *)0x840037);
    Stack<Kernel::Literal_*>::push(in_RSI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void loadFromIterator(It it) {
    // TODO check iterator.size() or iterator.sizeHint()
    while(it.hasNext()) {
      push(it.next());
    }
  }